

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondR.cpp
# Opt level: O2

void __thiscall OpenMD::HBondR::writeDensityR(HBondR *this)

{
  char cVar1;
  ostream *poVar2;
  uint uVar3;
  ulong uVar4;
  ofstream qRstream;
  
  std::ofstream::ofstream
            (&qRstream,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,_S_out);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    snprintf(painCave.errMsg,2000,"HBondR: unable to open %s\n",
             (this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar2 = std::operator<<((ostream *)&qRstream,"# ");
    poVar2 = std::operator<<(poVar2,(string *)&(this->super_StaticAnalyser).analysisType_);
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<((ostream *)&qRstream,"#selection 1: (");
    poVar2 = std::operator<<(poVar2,(string *)&this->selectionScript1_);
    std::operator<<(poVar2,")\n");
    poVar2 = std::operator<<((ostream *)&qRstream,"#selection 2: (");
    poVar2 = std::operator<<(poVar2,(string *)&this->selectionScript2_);
    std::operator<<(poVar2,")\n");
    poVar2 = std::operator<<((ostream *)&qRstream,"#selection 3: (");
    poVar2 = std::operator<<(poVar2,(string *)&this->selectionScript3_);
    std::operator<<(poVar2,")\n");
    if ((this->super_StaticAnalyser).paramString_._M_string_length != 0) {
      poVar2 = std::operator<<((ostream *)&qRstream,"# parameters: ");
      poVar2 = std::operator<<(poVar2,(string *)&(this->super_StaticAnalyser).paramString_);
      std::operator<<(poVar2,"\n");
    }
    poVar2 = std::operator<<((ostream *)&qRstream,"#distance");
    std::operator<<(poVar2,"\tH Bonds\n");
    for (uVar3 = 0; uVar4 = (ulong)uVar3,
        uVar4 < (ulong)((long)(this->sliceQ_).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->sliceQ_).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3); uVar3 = uVar3 + 1) {
      if ((this->sliceCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar4] != 0) {
        poVar2 = std::ostream::_M_insert<double>(((double)uVar4 + 0.5) * this->deltaR_);
        std::operator<<(poVar2,"\t");
        poVar2 = std::ostream::_M_insert<double>
                           ((this->sliceQ_).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar4] /
                            (double)(this->sliceCount_).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start[uVar4]);
        std::operator<<(poVar2,"\n");
      }
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&qRstream);
  return;
}

Assistant:

void HBondR::writeDensityR() {
    // compute average box length:

    std::ofstream qRstream(outputFilename_.c_str());
    if (qRstream.is_open()) {
      qRstream << "# " << getAnalysisType() << "\n";
      qRstream << "#selection 1: (" << selectionScript1_ << ")\n";
      qRstream << "#selection 2: (" << selectionScript2_ << ")\n";
      qRstream << "#selection 3: (" << selectionScript3_ << ")\n";
      if (!paramString_.empty())
        qRstream << "# parameters: " << paramString_ << "\n";

      qRstream << "#distance"
               << "\tH Bonds\n";
      for (unsigned int i = 0; i < sliceQ_.size(); ++i) {
        RealType Rval = (i + 0.5) * deltaR_;
        if (sliceCount_[i] != 0) {
          qRstream << Rval << "\t" << sliceQ_[i] / (RealType)sliceCount_[i]
                   << "\n";
        }
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "HBondR: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }
    qRstream.close();
  }